

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap14_char_map_def_binary(FT_Byte *base,FT_UInt32 char_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FT_UInt cnt;
  FT_ULong start;
  FT_Byte *p;
  uint local_28;
  FT_UInt32 mid;
  FT_UInt32 min;
  FT_UInt32 max;
  FT_UInt32 numRanges;
  FT_UInt32 char_code_local;
  FT_Byte *base_local;
  
  local_28 = 0;
  uVar1 = (uint)*base << 0x18 | (uint)base[1] << 0x10 | (uint)base[2] << 8 | (uint)base[3];
  while( true ) {
    do {
      mid = uVar1;
      if (mid <= local_28) {
        return 0;
      }
      uVar1 = local_28 + mid >> 1;
      uVar3 = uVar1 << 2;
      uVar2 = (uint)base[(ulong)uVar3 + 4] << 0x10 | (uint)base[(ulong)uVar3 + 5] << 8 |
              (uint)base[(ulong)uVar3 + 6];
    } while (char_code < uVar2);
    if (char_code <= uVar2 + base[(ulong)uVar3 + 7]) break;
    local_28 = uVar1 + 1;
    uVar1 = mid;
  }
  return 1;
}

Assistant:

static FT_UInt
  tt_cmap14_char_map_def_binary( FT_Byte    *base,
                                 FT_UInt32   char_code )
  {
    FT_UInt32  numRanges = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numRanges;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid   = ( min + max ) >> 1;
      FT_Byte*   p     = base + 4 * mid;
      FT_ULong   start = TT_NEXT_UINT24( p );
      FT_UInt    cnt   = FT_NEXT_BYTE( p );


      if ( char_code < start )
        max = mid;
      else if ( char_code > start + cnt )
        min = mid + 1;
      else
        return TRUE;
    }

    return FALSE;
  }